

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::async_buf_attach(Nvim *this,Buffer buffer,bool send_buffer,Dictionary *opts)

{
  allocator local_52;
  bool local_51;
  Buffer local_50;
  string local_48;
  
  local_51 = send_buffer;
  local_50 = buffer;
  std::__cxx11::string::string((string *)&local_48,"nvim_buf_attach",&local_52);
  NvimRPC::
  async_call<long,bool,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_48,&local_50,&local_51,opts);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::async_buf_attach(Buffer buffer, bool send_buffer, const Dictionary& opts) {
    client_.async_call("nvim_buf_attach", buffer, send_buffer, opts);
}